

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bheap.c
# Opt level: O2

void sx_bheap_push_max(sx_bheap *bh,int key,void *user)

{
  uint uVar1;
  int iVar2;
  undefined4 uVar3;
  sx_bheap_item *psVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  code *pcVar7;
  uint uVar8;
  
  uVar1 = bh->count;
  if (bh->capacity <= (int)uVar1) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/bheap.c",
                      0x79,"BinaryHeap\'s capacity exceeded");
    pcVar7 = (code *)swi(3);
    (*pcVar7)();
    return;
  }
  psVar4 = bh->items;
  psVar4[(int)uVar1].key = key;
  psVar4[(int)uVar1].user = user;
  while (0 < (int)uVar1) {
    uVar8 = uVar1 - 1 >> 1;
    psVar4 = bh->items;
    iVar2 = psVar4[uVar1].key;
    uVar3 = *(undefined4 *)((long)&psVar4[uVar1].user + 4);
    uVar5 = *(undefined8 *)&psVar4[uVar1].field_0x4;
    if (iVar2 <= psVar4[uVar8].key) break;
    psVar4[uVar1].key = psVar4[uVar8].key;
    uVar6 = *(undefined8 *)&psVar4[uVar8].field_0x4;
    *(undefined4 *)((long)&psVar4[uVar1].user + 4) = *(undefined4 *)((long)&psVar4[uVar8].user + 4);
    *(undefined8 *)&psVar4[uVar1].field_0x4 = uVar6;
    psVar4 = bh->items;
    psVar4[uVar8].key = iVar2;
    *(undefined8 *)&psVar4[uVar8].field_0x4 = uVar5;
    *(undefined4 *)((long)&psVar4[uVar8].user + 4) = uVar3;
    uVar1 = uVar8;
  }
  bh->count = bh->count + 1;
  return;
}

Assistant:

void sx_bheap_push_max(sx_bheap* bh, int key, void* user)
{
    sx_assertf(bh->count < bh->capacity, "BinaryHeap's capacity exceeded");

    // Put the value at the bottom the tree and traverse up
    int index = bh->count;
    bh->items[index].key = key;
    bh->items[index].user = user;

    while (index > 0) {
        int parent_idx = (index - 1) >> 1;
        sx_bheap_item cur = bh->items[index];
        sx_bheap_item parent = bh->items[parent_idx];

        if (cur.key > parent.key) {
            bh->items[index] = parent;
            bh->items[parent_idx] = cur;
        } else {
            break;
        }

        index = parent_idx;
    }
    ++bh->count;
}